

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_NtkSimulate(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Sfm_Dec_t *pSVar4;
  Vec_Ptr_t *p_00;
  word wVar5;
  Sfm_Dec_t *p;
  word uTemp;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  pAVar3 = Abc_NtkPi(pNtk,0);
  pSVar4 = Sfm_DecMan(pAVar3);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_WrdFill(&pSVar4->vObjSims,iVar1 << 1,0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_WrdFill(&pSVar4->vObjSims2,iVar1 << 1,0);
  Gia_ManRandomW(1);
  if (pSVar4->pPars->fUseSim == 0) {
    __assert_fail("p->pPars->fUseSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x14c,"void Sfm_NtkSimulate(Abc_Ntk_t *)");
  }
  for (uTemp._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), uTemp._4_4_ < iVar1;
      uTemp._4_4_ = uTemp._4_4_ + 1) {
    pAVar3 = Abc_NtkCi(pNtk,uTemp._4_4_);
    uVar2 = Abc_ObjId(pAVar3);
    wVar5 = Gia_ManRandomW(0);
    Vec_WrdWriteEntry(&pSVar4->vObjSims,uVar2,wVar5);
  }
  p_00 = Abc_NtkDfs(pNtk,1);
  for (uTemp._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), uTemp._4_4_ < iVar1;
      uTemp._4_4_ = uTemp._4_4_ + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,uTemp._4_4_);
    uVar2 = Abc_ObjId(pAVar3);
    wVar5 = Sfm_ObjSimulate(pAVar3);
    Vec_WrdWriteEntry(&pSVar4->vObjSims,uVar2,wVar5);
  }
  Vec_PtrFree(p_00);
  return;
}

Assistant:

static inline void Sfm_NtkSimulate( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj; int i; word uTemp;
    Sfm_Dec_t * p = Sfm_DecMan( Abc_NtkPi(pNtk, 0) );
    Vec_WrdFill( &p->vObjSims,  2*Abc_NtkObjNumMax(pNtk), 0 );
    Vec_WrdFill( &p->vObjSims2, 2*Abc_NtkObjNumMax(pNtk), 0 );
    Gia_ManRandomW(1);
    assert( p->pPars->fUseSim );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Vec_WrdWriteEntry( &p->vObjSims, Abc_ObjId(pObj), (uTemp = Gia_ManRandomW(0)) );
        //printf( "Inpt = %5d : ", Abc_ObjId(pObj) );
        //Extra_PrintBinary( stdout, (unsigned *)&uTemp, 64 );
        //printf( "\n" );
    }
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_WrdWriteEntry( &p->vObjSims, Abc_ObjId(pObj), (uTemp = Sfm_ObjSimulate(pObj)) );
        //printf( "Obj  = %5d : ", Abc_ObjId(pObj) );
        //Extra_PrintBinary( stdout, (unsigned *)&uTemp, 64 );
        //printf( "\n" );
    }
    Vec_PtrFree( vNodes );
}